

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
TryUseFixedAccessor(SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>
                    *this,PropertyRecord *propertyRecord,Var *pAccessor,
                   FixedPropertyKind propertyType,bool getter,ScriptContext *requestContext)

{
  bool bVar1;
  char16 *pcVar2;
  RecyclerWeakReference<Js::DynamicObject> *this_00;
  DynamicObject *this_01;
  ScriptContext *pSVar3;
  ScriptContext *requestContext_local;
  bool getter_local;
  FixedPropertyKind propertyType_local;
  Var *pAccessor_local;
  PropertyRecord *propertyRecord_local;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_local;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,FixedMethodsPhase);
  if (((((bVar1) && ((DAT_01ec73ca & 1) != 0)) ||
       ((bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,FixedMethodsPhase), bVar1 &&
        ((DAT_01ec73ca & 1) != 0)))) ||
      ((bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,UseFixedDataPropsPhase), bVar1 &&
       ((DAT_01ec73ca & 1) != 0)))) ||
     ((bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec73f0,UseFixedDataPropsPhase), bVar1 &&
      ((DAT_01ec73ca & 1) != 0)))) {
    pcVar2 = PropertyRecord::GetBuffer(propertyRecord);
    Output::Print(L"FixedFields: attempt to use fixed accessor %s from SimpleDictionaryTypeHandler returned false.\n"
                  ,pcVar2);
    bVar1 = HasSingletonInstance(this);
    if (bVar1) {
      this_00 = GetSingletonInstance(this);
      this_01 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_00);
      pSVar3 = RecyclableObject::GetScriptContext(&this_01->super_RecyclableObject);
      if (pSVar3 != requestContext) {
        pcVar2 = PropertyRecord::GetBuffer(propertyRecord);
        Output::Print(L"FixedFields: Cross Site Script Context is used for property %s. \n",pcVar2);
      }
    }
    Output::Flush();
  }
  return false;
}

Assistant:

bool SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::TryUseFixedAccessor(PropertyRecord const * propertyRecord, Var * pAccessor, FixedPropertyKind propertyType, bool getter, ScriptContext * requestContext)
    {
        if (PHASE_VERBOSE_TRACE1(Js::FixedMethodsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::FixedMethodsPhase) ||
            PHASE_VERBOSE_TRACE1(Js::UseFixedDataPropsPhase) || PHASE_VERBOSE_TESTTRACE1(Js::UseFixedDataPropsPhase))
        {
            Output::Print(_u("FixedFields: attempt to use fixed accessor %s from SimpleDictionaryTypeHandler returned false.\n"), propertyRecord->GetBuffer());
            if (this->HasSingletonInstance() && this->GetSingletonInstance()->Get()->GetScriptContext() != requestContext)
            {
                Output::Print(_u("FixedFields: Cross Site Script Context is used for property %s. \n"), propertyRecord->GetBuffer());
            }
            Output::Flush();
        }
        return false;
    }